

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dau_VerifyFile(char *pFileName)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  word wVar3;
  FILE *pFile;
  int nLines;
  int nFails;
  uint uTruth2;
  uint uTruth;
  char Buffer [1000];
  char *pFileName_local;
  
  pFile._4_4_ = 0;
  pFile._0_4_ = 0;
  Buffer._992_8_ = pFileName;
  __stream = fopen(pFileName,"rb");
  while( true ) {
    pcVar1 = fgets((char *)&uTruth2,1000,__stream);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = strlen((char *)&uTruth2);
    if (*(char *)((long)&nFails + sVar2 + 3) == '\n') {
      sVar2 = strlen((char *)&uTruth2);
      *(undefined1 *)((long)&nFails + sVar2 + 3) = 0;
    }
    sVar2 = strlen((char *)&uTruth2);
    if (*(char *)((long)&nFails + sVar2 + 3) == '\r') {
      sVar2 = strlen((char *)&uTruth2);
      *(undefined1 *)((long)&nFails + sVar2 + 3) = 0;
    }
    Extra_ReadHexadecimal((uint *)&nLines,(char *)&uTruth2,5);
    wVar3 = Dau_ParseFormula(Buffer + 3);
    nFails = (int)wVar3;
    if (nFails != nLines) {
      printf("Verification failed in line %d:  %s\n",(ulong)(uint)pFile,&uTruth2);
      pFile._4_4_ = pFile._4_4_ + 1;
    }
    pFile._0_4_ = (uint)pFile + 1;
  }
  printf("Verification succeeded for %d functions and failed for %d functions.\n",
         (ulong)((uint)pFile - pFile._4_4_),(ulong)pFile._4_4_);
  return;
}

Assistant:

void Dau_VerifyFile( char * pFileName )
{
    char Buffer[1000];
    unsigned uTruth, uTruth2; 
    int nFails = 0, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Extra_ReadHexadecimal( &uTruth2, Buffer, 5 );
        uTruth = (unsigned)Dau_ParseFormula( Buffer + 11 );
        if ( uTruth != uTruth2 )
            printf( "Verification failed in line %d:  %s\n", nLines, Buffer ), nFails++;
        nLines++;
    }
    printf( "Verification succeeded for %d functions and failed for %d functions.\n", nLines-nFails, nFails );
}